

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledBitmap.h
# Opt level: O2

bool __thiscall SSD1306::OledBitmap<128,_64>::isSetPixel(OledBitmap<128,_64> *this,OledPoint p)

{
  long lVar1;
  bool bVar2;
  
  bVar2 = OledPixel::pixelInside(&this->super_OledPixel,p);
  if (bVar2) {
    lVar1 = (long)((ulong)(uint)(p.m_x >> 0x1f) << 0x20 | (ulong)p & 0xffffffff) / 8;
    bVar2 = ((this->blocks_)._M_elems[(long)p >> 0x20]._M_elems[(int)lVar1] >>
             ((byte)(7 - ((char)p.m_x + (char)lVar1 * -8)) & 0x1f) & 1) != 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
    isSetPixel(
        SSD1306::OledPoint p) const override
    {
        if (not pixelInside(p))
        {
            return false;
        }

        PixelOffset offset{p};

        return blocks_[offset.block][offset.byte] & (1 << offset.bit);
    }